

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
::advance_past_empty_and_deleted
          (dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
           *this)

{
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *pdVar1;
  bool bVar2;
  pointer ppcVar3;
  char *local_18;
  
  ppcVar3 = this->pos;
  if (ppcVar3 != this->end) {
    do {
      local_18 = *ppcVar3;
      bVar2 = dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
              ::KeyInfo::equals<char_const*,char_const*>
                        ((KeyInfo *)&this->ht->key_info,&(this->ht->key_info).empty_key,&local_18);
      if (!bVar2) {
        pdVar1 = this->ht;
        if (pdVar1->num_deleted == 0) {
          return;
        }
        local_18 = *this->pos;
        bVar2 = dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
                ::KeyInfo::equals<char_const*,char_const*>
                          ((KeyInfo *)&pdVar1->key_info,&(pdVar1->key_info).delkey,&local_18);
        if (!bVar2) {
          return;
        }
      }
      ppcVar3 = this->pos + 1;
      this->pos = ppcVar3;
    } while (ppcVar3 != this->end);
  }
  return;
}

Assistant:

void advance_past_empty_and_deleted() {
    while (pos != end && (ht->test_empty(*this) || ht->test_deleted(*this)))
      ++pos;
  }